

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr
xmlCreateEntityParserCtxtInternal
          (xmlSAXHandlerPtr sax,void *userData,xmlChar *URL,xmlChar *ID,xmlChar *base,
          xmlParserCtxtPtr pctx)

{
  int iVar1;
  xmlChar *URL_00;
  xmlParserInputPtr pxVar2;
  xmlChar *uri;
  char *directory;
  xmlParserInputPtr inputStream;
  xmlParserCtxtPtr ctxt;
  xmlParserCtxtPtr pctx_local;
  xmlChar *base_local;
  xmlChar *ID_local;
  xmlChar *URL_local;
  void *userData_local;
  xmlSAXHandlerPtr sax_local;
  
  uri = (xmlChar *)0x0;
  sax_local = (xmlSAXHandlerPtr)xmlNewSAXParserCtxt(sax,userData);
  if ((xmlParserCtxtPtr)sax_local == (xmlParserCtxtPtr)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    if (pctx != (xmlParserCtxtPtr)0x0) {
      ((xmlParserCtxtPtr)sax_local)->options = pctx->options;
      ((xmlParserCtxtPtr)sax_local)->_private = pctx->_private;
      ((xmlParserCtxtPtr)sax_local)->input_id = pctx->input_id + 1;
    }
    iVar1 = xmlStrcmp(URL,"-");
    ID_local = URL;
    if (iVar1 == 0) {
      ID_local = "./-";
    }
    URL_00 = xmlBuildURI(ID_local,base);
    if (URL_00 == (xmlChar *)0x0) {
      pxVar2 = xmlLoadExternalEntity((char *)ID_local,(char *)ID,(xmlParserCtxtPtr)sax_local);
      if (pxVar2 == (xmlParserInputPtr)0x0) {
        xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
      else {
        inputPush((xmlParserCtxtPtr)sax_local,pxVar2);
        if (((xmlParserCtxtPtr)sax_local)->directory == (char *)0x0) {
          uri = (xmlChar *)xmlParserGetDirectory((char *)ID_local);
        }
        if ((((xmlParserCtxtPtr)sax_local)->directory == (char *)0x0) && (uri != (xmlChar *)0x0)) {
          ((xmlParserCtxtPtr)sax_local)->directory = (char *)uri;
        }
      }
    }
    else {
      pxVar2 = xmlLoadExternalEntity((char *)URL_00,(char *)ID,(xmlParserCtxtPtr)sax_local);
      if (pxVar2 == (xmlParserInputPtr)0x0) {
        (*xmlFree)(URL_00);
        xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
      else {
        inputPush((xmlParserCtxtPtr)sax_local,pxVar2);
        if (((xmlParserCtxtPtr)sax_local)->directory == (char *)0x0) {
          uri = (xmlChar *)xmlParserGetDirectory((char *)URL_00);
        }
        if ((((xmlParserCtxtPtr)sax_local)->directory == (char *)0x0) && (uri != (xmlChar *)0x0)) {
          ((xmlParserCtxtPtr)sax_local)->directory = (char *)uri;
        }
        (*xmlFree)(URL_00);
      }
    }
  }
  return (xmlParserCtxtPtr)sax_local;
}

Assistant:

static xmlParserCtxtPtr
xmlCreateEntityParserCtxtInternal(xmlSAXHandlerPtr sax, void *userData,
        const xmlChar *URL, const xmlChar *ID, const xmlChar *base,
        xmlParserCtxtPtr pctx) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    char *directory = NULL;
    xmlChar *uri;

    ctxt = xmlNewSAXParserCtxt(sax, userData);
    if (ctxt == NULL) {
	return(NULL);
    }

    if (pctx != NULL) {
        ctxt->options = pctx->options;
        ctxt->_private = pctx->_private;
	/*
	 * this is a subparser of pctx, so the input_id should be
	 * incremented to distinguish from main entity
	 */
	ctxt->input_id = pctx->input_id + 1;
    }

    /* Don't read from stdin. */
    if (xmlStrcmp(URL, BAD_CAST "-") == 0)
        URL = BAD_CAST "./-";

    uri = xmlBuildURI(URL, base);

    if (uri == NULL) {
	inputStream = xmlLoadExternalEntity((char *)URL, (char *)ID, ctxt);
	if (inputStream == NULL) {
	    xmlFreeParserCtxt(ctxt);
	    return(NULL);
	}

	inputPush(ctxt, inputStream);

	if ((ctxt->directory == NULL) && (directory == NULL))
	    directory = xmlParserGetDirectory((char *)URL);
	if ((ctxt->directory == NULL) && (directory != NULL))
	    ctxt->directory = directory;
    } else {
	inputStream = xmlLoadExternalEntity((char *)uri, (char *)ID, ctxt);
	if (inputStream == NULL) {
	    xmlFree(uri);
	    xmlFreeParserCtxt(ctxt);
	    return(NULL);
	}

	inputPush(ctxt, inputStream);

	if ((ctxt->directory == NULL) && (directory == NULL))
	    directory = xmlParserGetDirectory((char *)uri);
	if ((ctxt->directory == NULL) && (directory != NULL))
	    ctxt->directory = directory;
	xmlFree(uri);
    }
    return(ctxt);
}